

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

void ON_Font::GetRunBounds
               (ON_Font *font,wchar_t *text,double font_height_pixels,
               TextHorizontalAlignment horizontal_alignment,TextVerticalAlignment vertical_alignment
               ,ON_2dPoint *bounds_min,ON_2dPoint *bounds_max,int *line_count)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  ON_FontMetrics *this;
  double dVar4;
  double scale;
  double h;
  ON_2dVector offset;
  ON_2dPoint last_line_basepoint;
  ON_2dPoint first_line_basepoint;
  undefined1 local_90 [8];
  ON_TextBox text_box;
  int height_of_LF;
  int height_of_I;
  ON_FontMetrics *fm;
  ON_Font *managed_font;
  int textlength;
  ON_wString run;
  ON_2dPoint *bounds_max_local;
  ON_2dPoint *bounds_min_local;
  TextVerticalAlignment vertical_alignment_local;
  TextHorizontalAlignment horizontal_alignment_local;
  double font_height_pixels_local;
  wchar_t *text_local;
  ON_Font *font_local;
  
  *line_count = 0;
  dVar4 = ON_2dPoint::Origin.y;
  bounds_min->x = ON_2dPoint::Origin.x;
  bounds_min->y = dVar4;
  dVar4 = ON_2dPoint::Origin.y;
  bounds_max->x = ON_2dPoint::Origin.x;
  bounds_max->y = dVar4;
  run.m_s = (wchar_t *)bounds_max;
  ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffffc0,text);
  iVar3 = ON_wString::Length((ON_wString *)&stack0xffffffffffffffc0);
  if (0 < iVar3) {
    fm = (ON_FontMetrics *)ManagedFont(font);
    if ((ON_Font *)fm == (ON_Font *)0x0) {
      fm = (ON_FontMetrics *)&Default;
    }
    this = FontMetrics((ON_Font *)fm);
    text_box.m_advance.j = ON_FontMetrics::AscentOfCapital(this);
    text_box.m_advance.i = ON_FontMetrics::LineSpace(this);
    ON_TextBox::ON_TextBox((ON_TextBox *)local_90);
    iVar3 = ON_FontGlyph::GetGlyphListBoundingBox(text,(ON_Font *)fm,(ON_TextBox *)local_90);
    *line_count = iVar3;
    if ((-1 < *line_count) && (bVar2 = ON_TextBox::IsSet((ON_TextBox *)local_90), bVar2)) {
      bounds_min->x = (double)(int)local_90._0_4_;
      bounds_min->y = (double)(int)local_90._4_4_;
      *(double *)run.m_s = (double)text_box.m_bbmin.i;
      *(double *)(run.m_s + 2) = (double)text_box.m_bbmin.j;
      dVar1 = ON_2dPoint::Origin.y;
      dVar4 = ON_2dPoint::Origin.x;
      ON_2dPoint::ON_2dPoint
                ((ON_2dPoint *)&offset.y,ON_2dPoint::Origin.x,
                 (double)((1 - *line_count) * text_box.m_advance.i));
      h = ON_2dVector::ZeroVector.x;
      offset.x = ON_2dVector::ZeroVector.y;
      if (horizontal_alignment == Left) {
        h = -dVar4;
      }
      else if (horizontal_alignment == Center) {
        h = (double)text_box.m_bbmax.i * -0.5 + -dVar4;
      }
      else if (horizontal_alignment == Right) {
        h = -dVar4 - (double)text_box.m_bbmax.i;
      }
      switch(vertical_alignment) {
      case Top:
        offset.x = -dVar1 - (double)text_box.m_advance.j;
        break;
      case MiddleOfTop:
        offset.x = (double)text_box.m_advance.j * -0.5 + -dVar1;
        break;
      case BottomOfTop:
        offset.x = -dVar1;
        break;
      case Middle:
        offset.x = (double)((*line_count + -1) * text_box.m_advance.i + text_box.m_advance.j) * 0.5
                   + -last_line_basepoint.x;
        break;
      case MiddleOfBottom:
        offset.x = (double)text_box.m_advance.j * -0.5 + -last_line_basepoint.x;
        break;
      case Bottom:
        offset.x = -last_line_basepoint.x;
        break;
      case BottomOfBoundingBox:
        offset.x = -bounds_min->y;
      }
      ON_2dPoint::operator+=(bounds_min,(ON_2dVector *)&h);
      ON_2dPoint::operator+=((ON_2dPoint *)run.m_s,(ON_2dVector *)&h);
      dVar4 = font_height_pixels / 256.0;
      if (0.0 < dVar4) {
        bounds_min->x = dVar4 * (double)(int)local_90._0_4_;
        *(double *)run.m_s = dVar4 * (double)text_box.m_bbmin.i;
        bounds_min->y = dVar4 * (double)(int)local_90._4_4_;
        *(double *)(run.m_s + 2) = dVar4 * (double)text_box.m_bbmin.j;
      }
    }
  }
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void ON_Font::GetRunBounds(
  const ON_Font& font,
  const wchar_t* text,
  double font_height_pixels,
  ON::TextHorizontalAlignment horizontal_alignment,
  ON::TextVerticalAlignment vertical_alignment,
  ON_2dPoint& bounds_min,
  ON_2dPoint& bounds_max, 
  int& line_count
)
{
  line_count = 0;
  bounds_min = ON_2dPoint::Origin;
  bounds_max = ON_2dPoint::Origin;

  ON_wString run = text;
  int textlength = run.Length();
  if(textlength < 1)
    return;

  const ON_Font* managed_font = font.ManagedFont();
  if (nullptr == managed_font)
    managed_font = &ON_Font::Default;

  const ON_FontMetrics& fm = managed_font->FontMetrics();

  const int height_of_I = fm.AscentOfCapital();
  const int height_of_LF = fm.LineSpace();

  ON_TextBox text_box;
  line_count = ON_FontGlyph::GetGlyphListBoundingBox(text, managed_font, text_box);
  if ( line_count < 0 || false == text_box.IsSet())
    return;

  bounds_min.x = text_box.m_bbmin.i;
  bounds_min.y = text_box.m_bbmin.j;

  bounds_max.x = text_box.m_bbmax.i;
  bounds_max.y = text_box.m_bbmax.j;

  // in text_box coordinate system (0.0) = left most baseline point of first line.
  const ON_2dPoint first_line_basepoint = ON_2dPoint::Origin;
  const ON_2dPoint last_line_basepoint(first_line_basepoint.x, -(line_count - 1)*height_of_LF);

  ON_2dVector offset = ON_2dVector::ZeroVector;

  switch (horizontal_alignment)
  {
  case ON::TextHorizontalAlignment::Left:
    offset.x = -first_line_basepoint.x;
    break;

  case ON::TextHorizontalAlignment::Center:
    // Text command uses m_max_basepoint (not bbmax)
    offset.x = -first_line_basepoint.x - 0.5*text_box.m_max_basepoint.i;
    break;

  case ON::TextHorizontalAlignment::Right:
    // Text command uses m_max_basepoint (not bbmax)
    offset.x = -first_line_basepoint.x - text_box.m_max_basepoint.i;
    break;
  default:
    break;
  }

  switch (vertical_alignment)
  {
  case ON::TextVerticalAlignment::Top:
    // (*,0) is at the top of an "I" on the first line.
    offset.y = -first_line_basepoint.y - height_of_I;
    break;
  case ON::TextVerticalAlignment::MiddleOfTop:
    // (*,0) is at the middle of an "I" on the first line.
    offset.y = -first_line_basepoint.y - 0.5*height_of_I;
    break;
  case ON::TextVerticalAlignment::BottomOfTop:
    // (*,0) is at the baseline of the first line.
    offset.y = -first_line_basepoint.y;
    break;

  case ON::TextVerticalAlignment::Middle:
    {
      // (*,0) is the vertical middle of lines (not vertical middle of glyph bounding box)
      double h = (line_count - 1)*height_of_LF + height_of_I;
      offset.y = -last_line_basepoint.y + 0.5*h;
    }
    break;

  case ON::TextVerticalAlignment::MiddleOfBottom:
    // (*,0) is at the middle of an "I" on the last line.
    offset.y = -last_line_basepoint.y  - 0.5*height_of_I;
    break;
  case ON::TextVerticalAlignment::Bottom:
    // (*,0) is at the basline of the last line.
    offset.y = -last_line_basepoint.y;
    break;
  case ON::TextVerticalAlignment::BottomOfBoundingBox:
    // (*,0) is on the bottom the the glyphs' bounding box
    offset.y = -bounds_min.y;
    break;
  default:
    break;
  }

  bounds_min += offset;
  bounds_max += offset;

  // scale is applied last.
  const double scale = font_height_pixels / (double)ON_Font::Constants::AnnotationFontCellHeight;
  if (scale > 0.0)
  {
    bounds_min.x = scale * text_box.m_bbmin.i;
    bounds_max.x = scale * text_box.m_bbmax.i;
    bounds_min.y = scale * text_box.m_bbmin.j;
    bounds_max.y = scale * text_box.m_bbmax.j;
  }
}